

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactor<double>::updateRow
          (CLUFactor<double> *this,int r,int lv,int prow,int pcol,double pval,double eps)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  int *piVar5;
  double *pdVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  Pring *pPVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  int iVar24;
  long lVar25;
  double dVar26;
  double dVar27;
  
  piVar15 = (this->u).row.start;
  piVar23 = (this->u).row.len;
  iVar24 = piVar15[r];
  iVar2 = piVar23[r];
  piVar23[r] = iVar2 + -1;
  iVar17 = iVar2 + iVar24 + -1;
  piVar3 = (this->u).row.idx;
  lVar18 = (long)iVar17;
  lVar25 = lVar18 * 4 + 4;
  do {
    lVar20 = lVar25 + -4;
    lVar14 = lVar25 + -4;
    lVar25 = lVar20;
  } while (*(int *)((long)piVar3 + lVar14) != pcol);
  pdVar4 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar27 = *(double *)((long)pdVar4 + lVar20 * 2) / pval;
  (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lv] = dVar27;
  (this->l).idx[lv] = r;
  *(int *)((long)piVar3 + lVar20) = piVar3[lVar18];
  *(double *)((long)pdVar4 + lVar20 * 2) = pdVar4[lVar18];
  iVar16 = piVar23[prow];
  if (1 < iVar2) {
    piVar5 = (this->temp).s_mark;
    pdVar6 = this->work;
    piVar7 = (this->temp).s_cact;
    piVar8 = (this->u).col.len;
    piVar9 = (this->u).col.idx;
    piVar10 = (this->u).col.start;
    do {
      iVar2 = piVar3[lVar18 + -1];
      lVar18 = lVar18 + -1;
      if (piVar5[iVar2] != 0) {
        piVar5[iVar2] = 0;
        iVar16 = iVar16 + -1;
        dVar26 = pdVar4[lVar18] - pdVar6[iVar2] * dVar27;
        pdVar4[lVar18] = dVar26;
        if (ABS(dVar26) <= eps) {
          piVar23[r] = piVar23[r] + -1;
          pdVar4[lVar18] = pdVar4[(long)iVar17 + -1];
          piVar3[lVar18] = piVar3[(long)iVar17 + -1];
          piVar21 = piVar7 + iVar2;
          *piVar21 = *piVar21 + -1;
          iVar17 = iVar17 + -1;
          iVar19 = piVar8[iVar2] + -1;
          piVar8[iVar2] = iVar19;
          lVar25 = (long)(iVar19 + piVar10[iVar2]);
          piVar21 = piVar9 + lVar25 + 1;
          do {
            piVar22 = piVar21 + -1;
            piVar1 = piVar21 + -1;
            piVar21 = piVar22;
          } while (*piVar1 != r);
          *piVar22 = piVar9[lVar25];
        }
      }
    } while (iVar24 < lVar18);
  }
  iVar24 = piVar23[r];
  iVar16 = iVar16 + iVar24;
  if ((this->u).row.max[r] < iVar16) {
    remaxRow(this,r,iVar16);
    piVar15 = (this->u).row.start;
    piVar23 = (this->u).row.len;
  }
  if (0 < (long)piVar23[prow]) {
    lVar18 = (long)piVar15[prow];
    lVar25 = piVar23[prow] + lVar18;
    iVar24 = iVar24 + piVar15[r];
    do {
      piVar15 = (this->u).row.idx;
      piVar3 = (this->temp).s_mark;
      iVar2 = piVar15[lVar18];
      if (piVar3[iVar2] == 0) {
        piVar3[iVar2] = 1;
      }
      else {
        dVar26 = -this->work[iVar2] * dVar27;
        if (eps < ABS(dVar26)) {
          (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar24] = dVar26;
          piVar15[iVar24] = iVar2;
          piVar15 = (this->u).row.len + r;
          *piVar15 = *piVar15 + 1;
          piVar15 = (this->u).col.len;
          iVar17 = piVar15[iVar2];
          if ((this->u).col.max[iVar2] <= iVar17) {
            remaxCol(this,iVar2,iVar17 + 1);
            piVar15 = (this->u).col.len;
            iVar17 = piVar15[iVar2];
          }
          iVar24 = iVar24 + 1;
          piVar3 = (this->u).col.idx;
          iVar16 = (this->u).col.start[iVar2];
          piVar15[iVar2] = iVar17 + 1;
          piVar3[(long)iVar17 + (long)iVar16] = r;
          piVar15 = (this->temp).s_cact + iVar2;
          *piVar15 = *piVar15 + 1;
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar25);
    piVar23 = (this->u).row.len;
  }
  pPVar11 = (this->temp).pivot_row;
  pPVar12 = pPVar11[r].next;
  pPVar13 = pPVar11[r].prev;
  pPVar12->prev = pPVar13;
  pPVar13->next = pPVar12;
  pPVar12 = (this->temp).pivot_rowNZ;
  iVar24 = piVar23[r];
  pPVar13 = pPVar12[iVar24].next;
  pPVar11[r].next = pPVar13;
  pPVar13->prev = pPVar11 + r;
  pPVar11[r].prev = pPVar12 + iVar24;
  pPVar12[iVar24].next = pPVar11 + r;
  (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[r] = -1.0;
  return lv + 1;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}